

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string_compare.cpp
# Opt level: O1

bool ON_String::EqualPath(char *path1,int element_count1,char *path2,int element_count2)

{
  ON__UINT32 OVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  char cVar5;
  char cVar6;
  long lVar7;
  bool bVar8;
  char null_terminator;
  char local_59;
  uint local_58;
  uint local_54;
  char *local_50;
  char *local_48;
  ulong local_40;
  long local_38;
  
  if ((path1 == (char *)0x0 && element_count1 != 0) || (element_count2 != 0 && path2 == (char *)0x0)
     ) {
    if (path1 == (char *)0x0 || path1 == path2) {
      return path1 == path2;
    }
    if (path2 == (char *)0x0) {
      return false;
    }
  }
  local_59 = '\0';
  if (element_count1 < 0) {
    element_count1 = Length(path1);
  }
  if (element_count2 < 0) {
    element_count2 = Length(path2);
  }
  if (element_count1 == 0) {
    path1 = &local_59;
  }
  if (element_count2 == 0) {
    path2 = &local_59;
  }
  bVar8 = true;
  if (element_count1 != element_count2 || path1 != path2) {
    uVar3 = element_count2;
    if (element_count1 < element_count2) {
      uVar3 = element_count1;
    }
    local_40 = (ulong)uVar3;
    if ((int)uVar3 < 1) {
      uVar3 = 0;
      local_54 = element_count2;
      local_58 = element_count1;
    }
    else {
      local_50 = path2 + local_40;
      local_48 = path1 + local_40;
      local_54 = element_count2;
      local_58 = element_count1;
      local_38 = (long)element_count1;
      if ((long)element_count2 < (long)element_count1) {
        local_38 = (long)element_count2;
      }
      lVar7 = 0;
      do {
        OVar1 = MapCodePointOrdinal((int)path1[lVar7],0x7f,
                                    MinimumOrdinal - ((int)path1[lVar7] - 0x41U < 0x3a));
        cVar5 = '/';
        if ((char)OVar1 != '\\') {
          cVar5 = (char)OVar1;
        }
        OVar1 = MapCodePointOrdinal((int)path2[lVar7],0x7f,
                                    MinimumOrdinal - ((int)path2[lVar7] - 0x41U < 0x3a));
        cVar6 = '/';
        if ((char)OVar1 != '\\') {
          cVar6 = (char)OVar1;
        }
        if (cVar5 != cVar6) {
          return false;
        }
        lVar7 = lVar7 + 1;
      } while ((int)local_38 != (int)lVar7);
      uVar3 = (uint)local_40;
      path2 = local_50;
      path1 = local_48;
    }
    uVar4 = uVar3;
    if ((int)uVar3 < (int)local_58) {
      lVar7 = 0;
      do {
        if (path1[lVar7] != '\0') {
          return false;
        }
        lVar7 = lVar7 + 1;
        uVar4 = local_58;
      } while (local_58 - uVar3 != (int)lVar7);
    }
    if ((int)uVar4 < (int)local_54) {
      lVar7 = 0;
      do {
        bVar8 = path2[lVar7] == '\0';
        if (!bVar8) {
          return bVar8;
        }
        iVar2 = (int)lVar7;
        lVar7 = lVar7 + 1;
      } while (~uVar4 + local_54 != iVar2);
    }
  }
  return bVar8;
}

Assistant:

bool ON_String::EqualPath(
  const char* path1,
  int element_count1,
  const char* path2,
  int element_count2
  )
{
  CHAR_STRING_EQUAL_PREAMBLE(path1,element_count1,path2,element_count2);

  unsigned int c1=0, c2=0;
  const int element_count
    = (element_count1 <= element_count2)
    ? element_count1
    : element_count2;
  int i;
  const bool bOrdinalIgnoreCase = ON_FileSystemPath::PlatformPathIgnoreCase();

  if (bOrdinalIgnoreCase)
  {
    for(i=0; i < element_count; i++)
    {
      c1 = ON_NormalizeUTF8PathSepartor((char)OrdinalUTF8ToIgnoreCase(*path1++));
      c2 = ON_NormalizeUTF8PathSepartor((char)OrdinalUTF8ToIgnoreCase(*path2++));
      if ( c1 != c2 )
        return false;
    }
  }
  else
  {
    for(i=0; i < element_count; i++)
    {
      c1 = ON_NormalizeUTF8PathSepartor(*path1++);
      c2 = ON_NormalizeUTF8PathSepartor(*path2++);
      if ( c1 != c2 )
        return false;
    }
  }

  for (/*empty init*/; i < element_count1; i++)
  {
    if ( 0 != (*path1++))
      return false;
  }

  for (/*empty init*/; i < element_count2; i++)
  {
    if ( 0 != (*path2++))
      return false;
  }

  return true;
}